

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::ByteSizeLong
          (CustomModel_CustomModelParamValue *this)

{
  uint32_t uVar1;
  long lVar2;
  ulong uVar3;
  size_t sStack_10;
  
  uVar1 = this->_oneof_case_[0];
  if (uVar1 == 0x3c) {
    uVar3 = google::protobuf::internal::WireFormatLite::BytesSize
                      ((string *)((this->value_).longvalue_ & 0xfffffffffffffffe));
  }
  else if (uVar1 == 0x14) {
    uVar3 = google::protobuf::internal::WireFormatLite::StringSize
                      ((string *)((this->value_).longvalue_ & 0xfffffffffffffffe));
  }
  else {
    if (uVar1 == 0x1e) {
      uVar3 = (ulong)(this->value_).intvalue_;
    }
    else {
      if (uVar1 != 0x28) {
        if (uVar1 == 0x32) {
          sStack_10 = 3;
        }
        else if (uVar1 == 10) {
          sStack_10 = 9;
        }
        else {
          sStack_10 = 0;
        }
        goto LAB_0028df2b;
      }
      uVar3 = (this->value_).longvalue_;
    }
    lVar2 = 0x3f;
    if ((uVar3 | 1) != 0) {
      for (; (uVar3 | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar3 = (ulong)((int)lVar2 * 9 + 0x49U >> 6);
  }
  sStack_10 = uVar3 + 2;
LAB_0028df2b:
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    sStack_10 = sStack_10 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sStack_10;
  return sStack_10;
}

Assistant:

size_t CustomModel_CustomModelParamValue::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CustomModel.CustomModelParamValue)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  switch (value_case()) {
    // double doubleValue = 10;
    case kDoubleValue: {
      total_size += 1 + 8;
      break;
    }
    // string stringValue = 20;
    case kStringValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_stringvalue());
      break;
    }
    // int32 intValue = 30;
    case kIntValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32Size(
          this->_internal_intvalue());
      break;
    }
    // int64 longValue = 40;
    case kLongValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int64Size(
          this->_internal_longvalue());
      break;
    }
    // bool boolValue = 50;
    case kBoolValue: {
      total_size += 2 + 1;
      break;
    }
    // bytes bytesValue = 60;
    case kBytesValue: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::BytesSize(
          this->_internal_bytesvalue());
      break;
    }
    case VALUE_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}